

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int experimental_hooks_remove_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  long in_RCX;
  long in_R8;
  undefined8 *in_R9;
  void *handle;
  long in_stack_00000008;
  int ret;
  void *opaque;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar1;
  
  if ((in_RCX == 0) && (in_R8 == 0)) {
    opaque = (void *)0x0;
    if (in_R9 != (undefined8 *)0x0) {
      if (in_stack_00000008 != 8) {
        return 0x16;
      }
      opaque = (void *)*in_R9;
    }
    if (opaque == (void *)0x0) {
      iVar1 = 0x16;
    }
    else {
      duckdb_je_hook_remove
                ((tsdn_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),opaque);
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int
experimental_hooks_remove_ctl(tsd_t *tsd, const size_t *mib, size_t miblen,
    void *oldp, size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	WRITEONLY();
	void *handle = NULL;
	WRITE(handle, void *);
	if (handle == NULL) {
		ret = EINVAL;
		goto label_return;
	}
	hook_remove(tsd_tsdn(tsd), handle);
	ret = 0;
label_return:
	return ret;
}